

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void de::anon_unknown_0::multiThreadTest(int numThreads)

{
  deBool dVar1;
  size_type __n;
  TestThread *this;
  reference ppTVar2;
  bool bVar3;
  int local_64;
  int local_60;
  int ndx_1;
  int ndx;
  allocator<de::(anonymous_namespace)::TestThread_*> local_49;
  value_type local_48;
  undefined1 local_40 [8];
  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  threads;
  undefined1 local_20 [4];
  deInt32 sharedVar;
  SpinBarrier barrier;
  int numThreads_local;
  
  barrier.m_numLeaving = numThreads;
  SpinBarrier::SpinBarrier((SpinBarrier *)local_20,numThreads);
  threads.
  super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  __n = (size_type)barrier.m_numLeaving;
  local_48 = (value_type)0x0;
  std::allocator<de::(anonymous_namespace)::TestThread_*>::allocator(&local_49);
  std::
  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ::vector((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
            *)local_40,__n,&local_48,&local_49);
  std::allocator<de::(anonymous_namespace)::TestThread_*>::~allocator(&local_49);
  for (local_60 = 0; local_60 < barrier.m_numLeaving; local_60 = local_60 + 1) {
    this = (TestThread *)operator_new(0x38);
    TestThread::TestThread
              (this,(SpinBarrier *)local_20,
               (deInt32 *)
               ((long)&threads.
                       super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),barrier.m_numLeaving,
               local_60);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                            *)local_40,(long)local_60);
    *ppTVar2 = this;
    do {
      dVar1 = ::deGetFalse();
      bVar3 = false;
      if (dVar1 == 0) {
        ppTVar2 = std::
                  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                  ::operator[]((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                                *)local_40,(long)local_60);
        bVar3 = *ppTVar2 != (value_type)0x0;
      }
      if (!bVar3) {
        deAssertFail("threads[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                     ,0xf3);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                            *)local_40,(long)local_60);
    Thread::start(&(*ppTVar2)->super_Thread);
  }
  for (local_64 = 0; local_64 < barrier.m_numLeaving; local_64 = local_64 + 1) {
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                            *)local_40,(long)local_64);
    Thread::join(&(*ppTVar2)->super_Thread);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
                            *)local_40,(long)local_64);
    if (*ppTVar2 != (value_type)0x0) {
      (*((*ppTVar2)->super_Thread)._vptr_Thread[1])();
    }
  }
  do {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0 ||
        threads.
        super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      deAssertFail("sharedVar == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                   ,0xfd);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::
  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ::~vector((vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
             *)local_40);
  SpinBarrier::~SpinBarrier((SpinBarrier *)local_20);
  return;
}

Assistant:

void multiThreadTest (int numThreads)
{
	SpinBarrier					barrier		(numThreads);
	volatile deInt32			sharedVar	= 0;
	std::vector<TestThread*>	threads		(numThreads, static_cast<TestThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestThread(barrier, &sharedVar, numThreads, ndx);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}

	DE_TEST_ASSERT(sharedVar == 0);
}